

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::TextureSpecCase::renderTex
          (TextureSpecCase *this,Surface *dst,deUint32 program,int width,int height)

{
  ContextWrapper *this_00;
  int iVar1;
  int iVar2;
  Context *ctx;
  Vec3 local_48;
  Vec3 local_3c;
  
  this_00 = &this->super_ContextWrapper;
  iVar1 = sglr::ContextWrapper::getWidth(this_00);
  iVar2 = sglr::ContextWrapper::getHeight(this_00);
  ctx = sglr::ContextWrapper::getCurrentContext(this_00);
  local_3c.m_data[0] = -1.0;
  local_3c.m_data[1] = -1.0;
  local_3c.m_data[2] = 0.0;
  local_48.m_data[0] = (float)width / (float)iVar1 + (float)width / (float)iVar1 + -1.0;
  local_48.m_data[1] = (float)height / (float)iVar2 + (float)height / (float)iVar2 + -1.0;
  local_48.m_data[2] = 0.0;
  sglr::drawQuad(ctx,program,&local_3c,&local_48);
  readPixels(this,dst,0,0,width,height);
  return;
}

Assistant:

void TextureSpecCase::renderTex (tcu::Surface& dst, deUint32 program, int width, int height)
{
	int		targetW		= getWidth();
	int		targetH		= getHeight();

	float	w			= (float)width	/ (float)targetW;
	float	h			= (float)height	/ (float)targetH;

	sglr::drawQuad(*getCurrentContext(), program, tcu::Vec3(-1.0f, -1.0f, 0.0f), tcu::Vec3(-1.0f + w*2.0f, -1.0f + h*2.0f, 0.0f));

	// Read pixels back.
	readPixels(dst, 0, 0, width, height);
}